

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedNodeMap.c
# Opt level: O1

IXML_Node * ixmlNamedNodeMap_item(IXML_NamedNodeMap *nnMap,unsigned_long index)

{
  ulong uVar1;
  IXML_Node *pIVar2;
  uint uVar3;
  
  if (nnMap != (IXML_NamedNodeMap *)0x0) {
    uVar1 = 0xffffffffffffffff;
    for (pIVar2 = nnMap->nodeItem; pIVar2 != (IXML_Node *)0x0; pIVar2 = pIVar2->nextSibling) {
      uVar1 = uVar1 + 1;
    }
    if (index <= uVar1) {
      pIVar2 = nnMap->nodeItem;
      if (pIVar2 == (IXML_Node *)0x0 || index == 0) {
        return pIVar2;
      }
      uVar3 = 1;
      do {
        pIVar2 = pIVar2->nextSibling;
        if (index <= uVar3) {
          return pIVar2;
        }
        uVar3 = uVar3 + 1;
      } while (pIVar2 != (IXML_Node *)0x0);
      return (IXML_Node *)0x0;
    }
  }
  return (IXML_Node *)0x0;
}

Assistant:

IXML_Node *ixmlNamedNodeMap_item(
	/* IN */ IXML_NamedNodeMap *nnMap,
	/* IN */ unsigned long index)
{
	IXML_Node *tempNode;
	unsigned int i;

	if (nnMap == NULL) {
		return NULL;
	}

	if (index > ixmlNamedNodeMap_getLength(nnMap) - 1lu) {
		return NULL;
	}

	tempNode = nnMap->nodeItem;
	for (i = 0u; i < index && tempNode != NULL; ++i) {
		tempNode = tempNode->nextSibling;
	}

	return tempNode;
}